

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

void prvTidyFreeDeclaredTags(TidyDocImpl *doc,UserTagType tagType)

{
  Dict *pDVar1;
  ctmbstr s1;
  DictHash *pDVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  _DictHash **pp_Var6;
  Dict **ppDVar7;
  code *pcVar8;
  char *pcVar9;
  DictHash *pDVar10;
  char cVar11;
  Dict *pDVar12;
  DictHash *pDVar13;
  Dict *local_58;
  
  pDVar12 = (doc->tags).declared_tag_list;
  if (pDVar12 != (Dict *)0x0) {
    local_58 = (Dict *)0x0;
    do {
      pDVar1 = pDVar12->next;
      switch(tagType) {
      case tagtype_empty:
        uVar3 = pDVar12->model;
        break;
      case tagtype_inline:
        uVar3 = pDVar12->model >> 4;
        break;
      default:
        goto switchD_0012f7ff_caseD_3;
      case tagtype_block:
        if ((pDVar12->model & 8) == 0) goto LAB_0012f935;
        pcVar8 = prvTidyParseBlock;
LAB_0012f835:
        uVar3 = (uint)(pDVar12->parser == pcVar8);
        goto LAB_0012f83c;
      case tagtype_pre:
        if ((pDVar12->model & 8) != 0) {
          pcVar8 = prvTidyParsePre;
          goto LAB_0012f835;
        }
        goto LAB_0012f935;
      }
      uVar3 = uVar3 & 1;
LAB_0012f83c:
      if (uVar3 != 0) {
switchD_0012f7ff_caseD_3:
        s1 = pDVar12->name;
        cVar11 = *s1;
        if (cVar11 == '\0') {
          uVar5 = 0;
        }
        else {
          uVar3 = 0;
          pcVar9 = s1;
          do {
            pcVar9 = pcVar9 + 1;
            uVar3 = uVar3 * 0x1f + (int)cVar11;
            cVar11 = *pcVar9;
          } while (cVar11 != '\0');
          uVar5 = (ulong)(uVar3 % 0xb2);
        }
        pDVar2 = (doc->tags).hashtab[uVar5];
        if (pDVar2 != (DictHash *)0x0) {
          pDVar13 = (DictHash *)0x0;
          do {
            pDVar10 = pDVar2;
            if (pDVar10->tag == (Dict *)0x0) break;
            iVar4 = prvTidytmbstrcmp(s1,pDVar10->tag->name);
            pDVar2 = pDVar10->next;
            if (iVar4 == 0) {
              pp_Var6 = &pDVar13->next;
              if (pDVar13 == (DictHash *)0x0) {
                pp_Var6 = (doc->tags).hashtab + uVar5;
              }
              *pp_Var6 = pDVar2;
              (*doc->allocator->vtbl->free)(doc->allocator,pDVar10);
              break;
            }
            pDVar13 = pDVar10;
          } while (pDVar2 != (_DictHash *)0x0);
        }
        (*doc->allocator->vtbl->free)(doc->allocator,pDVar12->name);
        (*doc->allocator->vtbl->free)(doc->allocator,pDVar12);
        ppDVar7 = &local_58->next;
        if (local_58 == (Dict *)0x0) {
          ppDVar7 = &(doc->tags).declared_tag_list;
        }
        *ppDVar7 = pDVar1;
        pDVar12 = local_58;
      }
LAB_0012f935:
      local_58 = pDVar12;
      pDVar12 = pDVar1;
    } while (pDVar1 != (Dict *)0x0);
  }
  return;
}

Assistant:

void TY_(FreeDeclaredTags)( TidyDocImpl* doc, UserTagType tagType )
{
    TidyTagImpl* tags = &doc->tags;
    Dict *curr, *next = NULL, *prev = NULL;

    for ( curr=tags->declared_tag_list; curr; curr = next )
    {
        Bool deleteIt = yes;
        next = curr->next;
        switch ( tagType )
        {
        case tagtype_empty:
            deleteIt = ( curr->model & CM_EMPTY ) != 0;
            break;

        case tagtype_inline:
            deleteIt = ( curr->model & CM_INLINE ) != 0;
            break;

        case tagtype_block:
            deleteIt = ( (curr->model & CM_BLOCK) != 0 &&
                         curr->parser == TY_(ParseBlock) );
            break;

        case tagtype_pre:
            deleteIt = ( (curr->model & CM_BLOCK) != 0 &&
                         curr->parser == TY_(ParsePre) );
            break;

        case tagtype_null:
            break;
        }

        if ( deleteIt )
        {
#if ELEMENT_HASH_LOOKUP
          tagsRemoveFromHash( doc, &doc->tags, curr->name );
#endif
          FreeDict( doc, curr );
          if ( prev )
            prev->next = next;
          else
            tags->declared_tag_list = next;
        }
        else
          prev = curr;
    }
}